

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dielectric.hpp
# Opt level: O1

Color __thiscall
DielectricBRDF::sample_f
          (DielectricBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  float extraout_XMM0_Da;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  Color CVar9;
  float local_4c;
  
  fVar6 = *(float *)&(this->super_DiracBxDF).field_0x8;
  uVar3 = -(uint)(0.0 < wo->z);
  fVar8 = ABS(wo->z);
  auVar7._0_4_ = (float)(uVar3 & (uint)fVar6 | ~uVar3 & (uint)(1.0 / fVar6));
  fVar6 = 1.0 - fVar8 * fVar8;
  if (fVar6 <= 0.0) {
    fVar6 = 0.0;
  }
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar5 = 1.0;
  fVar6 = fVar6 / auVar7._0_4_;
  if (fVar6 < 1.0) {
    fVar6 = 1.0 - fVar6 * fVar6;
    if (fVar6 < 0.0) {
      local_4c = sqrtf(fVar6);
    }
    else {
      local_4c = SQRT(fVar6);
    }
    fVar5 = (auVar7._0_4_ * fVar8 - local_4c) / (auVar7._0_4_ * fVar8 + local_4c);
    fVar6 = (fVar8 - auVar7._0_4_ * local_4c) / (auVar7._0_4_ * local_4c + fVar8);
    fVar5 = (fVar6 * fVar6 + fVar5 * fVar5) * 0.5;
  }
  if ((fVar5 != 1.0) || (NAN(fVar5))) {
    (**sampler->_vptr_Sampler)(sampler);
    if (fVar5 <= extraout_XMM0_Da) {
      fVar6 = wo->z;
      uVar2._0_4_ = wo->x;
      uVar2._4_4_ = wo->y;
      auVar4._0_8_ = uVar2 ^ 0x8000000080000000;
      auVar4._8_4_ = 0x80000000;
      auVar4._12_4_ = 0x80000000;
      auVar7._4_4_ = auVar7._0_4_;
      auVar7._8_8_ = 0;
      auVar4 = divps(auVar4,auVar7);
      wi->x = (float)(int)auVar4._0_8_;
      wi->y = (float)(int)((ulong)auVar4._0_8_ >> 0x20);
      wi->z = (local_4c * -fVar6) / ABS(fVar6);
      *pdf = 1.0 - fVar5;
      fVar5 = (1.0 - fVar5) / (ABS(wi->z) * auVar7._0_4_ * auVar7._0_4_);
      goto LAB_0013d99c;
    }
  }
  uVar1._0_4_ = wo->x;
  uVar1._4_4_ = wo->y;
  fVar6 = wo->z;
  wi->x = (float)(int)(uVar1 ^ 0x8000000080000000);
  wi->y = (float)(int)((uVar1 ^ 0x8000000080000000) >> 0x20);
  wi->z = fVar6;
  *pdf = fVar5;
  fVar5 = fVar5 / ABS(wi->z);
LAB_0013d99c:
  CVar9.y = fVar5;
  CVar9.x = fVar5;
  CVar9.z = fVar5;
  return CVar9;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		float ior = wo.z>0? IOR: 1/IOR;
		float cost;
		float r = reflectivity(fabs(wo.z), cost, ior);

		if (r == 1 || sampler.get1f()<r) // reflected
		{
			wi = vec3f(-wo.x, -wo.y, wo.z);
			pdf = r;
			return r / fabs(wi.z);
		}
		else // transmitted
		{
			wi = vec3f(-wo.x/ior, -wo.y/ior, -wo.z * cost/fabs(wo.z));
			pdf = 1-r;
			return (1-r) / (fabs(wi.z) * ior * ior);
			// the 1/ior^2 coefficient is used to convert energy to radiance
			// see note_refract_radiance
		}
	}